

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger.cpp
# Opt level: O3

void QTestPrivate::generateTestIdentifier(QTestCharBuffer *identifier,int parts)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  
  pcVar3 = "";
  if ((parts & 1U) != 0) {
    pcVar3 = QTestResult::currentTestObjectName();
  }
  pcVar8 = "";
  if ((parts & 2U) != 0) {
    pcVar8 = QTestResult::currentTestFunction();
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "UnknownTestFunc";
    }
    else {
      pcVar8 = QTestResult::currentTestFunction();
    }
  }
  pcVar7 = "";
  pcVar6 = "";
  if ((parts & 4U) != 0) {
    pcVar1 = QTestResult::currentDataTag();
    pcVar6 = "";
    pcVar7 = "";
    if (pcVar1 != (char *)0x0) {
      pcVar7 = QTestResult::currentDataTag();
    }
    pcVar1 = QTestResult::currentGlobalDataTag();
    if (pcVar1 != (char *)0x0) {
      pcVar6 = QTestResult::currentGlobalDataTag();
    }
  }
  pcVar1 = "";
  if ((*pcVar7 != '\0') && (pcVar1 = ":", *pcVar6 == '\0')) {
    pcVar1 = "";
  }
  bVar9 = (parts & 2U) == 0;
  pcVar5 = ")";
  if (bVar9) {
    pcVar5 = "";
  }
  pcVar4 = "(";
  if (bVar9) {
    pcVar4 = "";
  }
  pcVar2 = "::";
  if ((parts & 6U) == 0) {
    pcVar2 = "";
  }
  if ((parts & 1U) == 0) {
    pcVar2 = "";
  }
  QTest::qt_asprintf(identifier,"%s%s%s%s%s%s%s%s",pcVar3,pcVar2,pcVar8,pcVar4,pcVar6,pcVar1,pcVar7,
                     pcVar5);
  return;
}

Assistant:

void generateTestIdentifier(QTestCharBuffer *identifier, int parts)
{
    const char *testObject = parts & TestObject ? QTestResult::currentTestObjectName() : "";
    const char *testFunction = parts & TestFunction ? (QTestResult::currentTestFunction() ? QTestResult::currentTestFunction() : "UnknownTestFunc") : "";
    const char *objectFunctionFiller = parts & TestObject && parts & (TestFunction | TestDataTag) ? "::" : "";
    const char *testFuctionStart = parts & TestFunction ? "(" : "";
    const char *testFuctionEnd = parts & TestFunction ? ")" : "";

    const char *dataTag = (parts & TestDataTag) && QTestResult::currentDataTag() ? QTestResult::currentDataTag() : "";
    const char *globalDataTag = (parts & TestDataTag) && QTestResult::currentGlobalDataTag() ? QTestResult::currentGlobalDataTag() : "";
    const char *tagFiller = (dataTag[0] && globalDataTag[0]) ? ":" : "";

    QTest::qt_asprintf(identifier, "%s%s%s%s%s%s%s%s",
        testObject, objectFunctionFiller, testFunction, testFuctionStart,
        globalDataTag, tagFiller, dataTag, testFuctionEnd);
}